

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract(data_view *data,DataType baseType,complex<double> *val)

{
  long lVar1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  double dVar2;
  double extraout_XMM0_Qa_01;
  undefined8 in_XMM1_Qa;
  undefined8 uVar3;
  basic_string_view<char,_std::char_traits<char>_> val_00;
  string_view val_01;
  vector<double,_std::allocator<double>_> vec;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_40;
  
  switch(baseType) {
  case HELICS_DOUBLE:
    dVar2 = ValueConverter<double>::interpret(data);
    goto LAB_001c50e7;
  case HELICS_INT:
    lVar1 = ValueConverter<long>::interpret(data);
    dVar2 = (double)lVar1;
LAB_001c50e7:
    *(double *)val->_M_value = dVar2;
LAB_001c50eb:
    *(undefined8 *)(val->_M_value + 8) = 0;
    break;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::interpret(data);
    uVar3 = extraout_XMM0_Qa_00;
    goto LAB_001c5088;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)&local_40._M_first,data);
    uVar3 = 0;
    if (local_40._8_8_ - local_40._0_8_ == 8) {
LAB_001c50c1:
      *(undefined8 *)val->_M_value = *(undefined8 *)local_40._M_first._M_storage;
      *(undefined8 *)(val->_M_value + 8) = uVar3;
    }
    else if (8 < (ulong)(local_40._8_8_ - local_40._0_8_)) {
      uVar3 = *(undefined8 *)((long)local_40._M_first._M_storage + 8);
      goto LAB_001c50c1;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_40._M_first);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
              &local_40._M_first,data);
    if (local_40._M_first._M_storage != (_Uninitialized<double,_true>)local_40._8_8_) {
      uVar3 = *(undefined8 *)((long)local_40._M_first._M_storage + 8);
      *(undefined8 *)val->_M_value = *(undefined8 *)local_40._M_first._M_storage;
      *(undefined8 *)(val->_M_value + 8) = uVar3;
    }
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               &local_40._M_first);
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)&local_40._M_first,data);
    uVar3 = 0;
    if (NAN((double)local_40._32_8_)) {
      val_01._M_str = (char *)local_40._M_first._M_storage;
      val_01._M_len = local_40._8_8_;
      helicsGetComplex(val_01);
      local_40._32_8_ = extraout_XMM0_Qa_01;
    }
    *(undefined8 *)val->_M_value = local_40._32_8_;
    *(undefined8 *)(val->_M_value + 8) = uVar3;
    std::__cxx11::string::~string((string *)&local_40._M_first);
    break;
  case HELICS_TIME:
    lVar1 = ValueConverter<long>::interpret(data);
    *(double *)val->_M_value = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
    goto LAB_001c50eb;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)&local_40._M_first,(helics *)data,(data_view *)val);
      valueExtract((defV *)&local_40._M_first,val);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&local_40._M_first);
      return;
    }
  case HELICS_BOOL:
    val_00 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data)
    ;
    helicsGetComplex(val_00);
    uVar3 = extraout_XMM0_Qa;
LAB_001c5088:
    *(undefined8 *)val->_M_value = uVar3;
    *(undefined8 *)(val->_M_value + 8) = in_XMM1_Qa;
    return;
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::complex<double>& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val = std::complex<double>(ValueConverter<double>::interpret(data), 0.0);
            break;
        }
        case DataType::HELICS_INT: {
            val =
                std::complex<double>(static_cast<double>(ValueConverter<int64_t>::interpret(data)),
                                     0.0);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val = std::complex<double>(static_cast<double>(time), 0.0);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            val = helicsGetComplex(ValueConverter<std::string_view>::interpret(data));
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetComplex(npval.name);
            } else {
                val = std::complex<double>(npval.value, 0.0);
            }
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            if (vec.size() == 1) {
                val = std::complex<double>(vec[0], 0.0);
            } else if (vec.size() >= 2) {
                val = std::complex<double>(vec[0], vec[1]);
            }
            break;
        }
        case DataType::HELICS_COMPLEX:
            val = ValueConverter<std::complex<double>>::interpret(data);
            break;
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            if (!cvec.empty()) {
                val = cvec[0];
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}